

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_add(hsts *h,char *line)

{
  int iVar1;
  stsentry *psVar2;
  bool subdomain_00;
  long local_1b0;
  stsentry *e;
  char *pcStack_198;
  _Bool subdomain;
  char *p;
  CURLcode result;
  time_t expires;
  char local_178 [4];
  int rc;
  char date [65];
  char local_128;
  char acStack_127 [7];
  char host [257];
  char *line_local;
  hsts *h_local;
  
  unique0x100000f7 = line;
  iVar1 = __isoc99_sscanf(line,"%256s \"%64[^\"]\"",&local_128,local_178);
  if (iVar1 == 2) {
    iVar1 = strcmp(local_178,"unlimited");
    if (iVar1 == 0) {
      local_1b0 = 0x7fffffffffffffff;
    }
    else {
      local_1b0 = Curl_getdate_capped(local_178);
    }
    p._4_4_ = CURLE_OK;
    pcStack_198 = &local_128;
    subdomain_00 = local_128 == '.';
    if (subdomain_00) {
      pcStack_198 = acStack_127;
    }
    psVar2 = Curl_hsts(h,pcStack_198,subdomain_00);
    if (psVar2 == (stsentry *)0x0) {
      p._4_4_ = hsts_create(h,pcStack_198,subdomain_00,local_1b0);
    }
    else {
      iVar1 = curl_strequal(pcStack_198,psVar2->host);
      if ((iVar1 != 0) && (psVar2->expires < local_1b0)) {
        psVar2->expires = local_1b0;
      }
    }
    if (p._4_4_ != CURLE_OK) {
      return p._4_4_;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode hsts_add(struct hsts *h, char *line)
{
  /* Example lines:
     example.com "20191231 10:00:00"
     .example.net "20191231 10:00:00"
   */
  char host[MAX_HSTS_HOSTLEN + 1];
  char date[MAX_HSTS_DATELEN + 1];
  int rc;

  rc = sscanf(line,
              "%" MAX_HSTS_HOSTLENSTR "s \"%" MAX_HSTS_DATELENSTR "[^\"]\"",
              host, date);
  if(2 == rc) {
    time_t expires = strcmp(date, UNLIMITED) ? Curl_getdate_capped(date) :
      TIME_T_MAX;
    CURLcode result = CURLE_OK;
    char *p = host;
    bool subdomain = FALSE;
    struct stsentry *e;
    if(p[0] == '.') {
      p++;
      subdomain = TRUE;
    }
    /* only add it if not already present */
    e = Curl_hsts(h, p, subdomain);
    if(!e)
      result = hsts_create(h, p, subdomain, expires);
    else if(strcasecompare(p, e->host)) {
      /* the same hostname, use the largest expire time */
      if(expires > e->expires)
        e->expires = expires;
    }
    if(result)
      return result;
  }

  return CURLE_OK;
}